

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerApp::DisableJoiner
          (Error *__return_storage_ptr__,CommissionerApp *this,JoinerType aType,uint64_t aEui64)

{
  ErrorCode EVar1;
  element_type *peVar2;
  int iVar3;
  vector<unsigned_char,std::allocator<unsigned_char>> *aSteeringData;
  _Base_ptr p_Var4;
  char *begin;
  char *pcVar5;
  Error *pEVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  ByteArray joinerId;
  undefined1 local_108 [8];
  undefined1 local_100 [32];
  parse_func local_e0 [1];
  string local_d0;
  CommissionerDataset local_b0;
  undefined1 local_58 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CommissionerDataset::CommissionerDataset(&local_b0,&this->mCommDataset);
  local_b0.mPresentFlags._1_1_ = local_b0.mPresentFlags._1_1_ & 0x3f;
  aSteeringData =
       (vector<unsigned_char,std::allocator<unsigned_char>> *)GetSteeringData(&local_b0,aType);
  iVar3 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar3 == '\0') {
    local_108._0_4_ = kMeshCoP;
    local_100._0_8_ = "the commissioner is not active";
    local_100._8_8_ = (pointer)0x1e;
    local_100._16_8_ = 0;
    local_e0[0] = (parse_func)0x0;
    pcVar5 = "the commissioner is not active";
    local_100._24_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_108;
    while (begin = pcVar5, begin != "") {
      pcVar5 = begin + 1;
      if (*begin == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_108);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_108;
    ::fmt::v10::vformat_abi_cxx11_(&local_d0,(v10 *)0x2157e0,(string_view)ZEXT816(0x1e),args);
    local_58._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_d0);
    Error::operator=(__return_storage_ptr__,(Error *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    local_108._0_4_ = local_108._0_4_ & 0xffffff00;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
              (aSteeringData,local_108);
    for (p_Var4 = (this->mJoiners)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->mJoiners)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      if ((p_Var4[2]._M_color != aType) || (p_Var4[2]._M_parent != (_Base_ptr)aEui64)) {
        Commissioner::ComputeJoinerId((ByteArray *)local_108,aEui64);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  (&joinerId,
                   (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
        Commissioner::AddJoiner((ByteArray *)aSteeringData,&joinerId);
      }
    }
    peVar2 = (this->mCommissioner).
             super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_Commissioner[0x14])(local_108,peVar2,&local_b0);
    pEVar6 = Error::operator=(__return_storage_ptr__,(Error *)local_108);
    EVar1 = pEVar6->mCode;
    std::__cxx11::string::~string((string *)local_100);
    if (EVar1 == kNone) {
      MergeDataset(&this->mCommDataset,&local_b0);
      local_108._0_4_ = aType;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_100,&joinerId);
      std::
      _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,_std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>,_std::_Select1st<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
      ::erase(&(this->mJoiners)._M_t,(key_type *)local_108);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_100);
    }
  }
  CommissionerDataset::~CommissionerDataset(&local_b0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::DisableJoiner(JoinerType aType, uint64_t aEui64)
{
    Error     error;
    ByteArray joinerId;
    auto      commDataset = mCommDataset;
    commDataset.mPresentFlags &= ~CommissionerDataset::kSessionIdBit;
    commDataset.mPresentFlags &= ~CommissionerDataset::kBorderAgentLocatorBit;
    auto &steeringData = GetSteeringData(commDataset, aType);

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    steeringData = {0x00};
    for (const auto &kv : mJoiners)
    {
        auto &joiner = kv.second;
        if (joiner.mType == aType && joiner.mEui64 == aEui64)
        {
            continue;
        }
        joinerId = Commissioner::ComputeJoinerId(aEui64);
        Commissioner::AddJoiner(steeringData, joinerId);
    }

    SuccessOrExit(error = mCommissioner->SetCommissionerDataset(commDataset));

    MergeDataset(mCommDataset, commDataset);
    mJoiners.erase(JoinerKey{aType, joinerId});

exit:
    return error;
}